

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

void __thiscall QSystemLocale::~QSystemLocale(QSystemLocale *this)

{
  QSystemLocale *p;
  QSystemLocale *pQVar1;
  
  this->_vptr_QSystemLocale = (_func_int **)&PTR__QSystemLocale_006acf60;
  pQVar1 = _systemLocale;
  if (_systemLocale == this) {
    _systemLocale = this->next;
    systemLocaleData.m_language_id = 0;
  }
  else {
    for (; pQVar1 != (QSystemLocale *)0x0; pQVar1 = pQVar1->next) {
      if (pQVar1->next == this) {
        pQVar1->next = this->next;
      }
    }
  }
  return;
}

Assistant:

QSystemLocale::~QSystemLocale()
{
    if (_systemLocale == this) {
        _systemLocale = next;

        // Change to system locale => force refresh.
        systemLocaleData.m_language_id = 0;
    } else {
        for (QSystemLocale *p = _systemLocale; p; p = p->next) {
            if (p->next == this)
                p->next = next;
        }
    }
}